

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O3

int INT_REVunfreeze_stone(CMConnection conn,EVstone stone_id)

{
  int condition;
  CMFormat format;
  EV_int_response response;
  int local_30;
  EVstone local_2c;
  undefined1 local_28 [4];
  int local_24;
  
  condition = INT_CMCondition_get(conn->cm,conn);
  format = INT_CMlookup_format(conn->cm,EVunfreeze_stone_req_formats);
  local_30 = condition;
  local_2c = stone_id;
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format(conn->cm,EVunfreeze_stone_req_formats);
  }
  INT_CMCondition_set_client_data(conn->cm,condition,local_28);
  INT_CMwrite(conn,format,&local_30);
  INT_CMCondition_wait(conn->cm,condition);
  return local_24;
}

Assistant:

extern int
INT_REVunfreeze_stone(CMConnection conn, EVstone stone_id)
{
    int cond;
    CMFormat f;
    EV_int_response response;
    EVunfreeze_stone_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVunfreeze_stone_req_formats);
    request.stone_id = stone_id;
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVunfreeze_stone_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, &response);
    INT_CMwrite(conn, f, &request);
    INT_CMCondition_wait(conn->cm, cond);
    return response.ret;
}